

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O2

span<unsigned_long,_18446744073709551615UL> __thiscall
Disa::Adjacency_Graph<false>::operator[](Adjacency_Graph<false> *this,size_t *i_vertex)

{
  ulong uVar1;
  ostream *poVar2;
  source_location *location;
  span<unsigned_long,_18446744073709551615UL> sVar3;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  location = *(source_location **)(this + 0x18);
  if ((*(long *)(this + 0x20) - (long)location != 0) &&
     (uVar1 = *i_vertex, uVar1 < (*(long *)(this + 0x20) - (long)location >> 3) - 1U)) {
    sVar3._M_ptr = (pointer)((long)location[uVar1]._M_impl * 8 + *(long *)this);
    sVar3._M_extent._M_extent_value =
         (long)location[uVar1 + 1]._M_impl - (long)location[uVar1]._M_impl;
    return sVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00169468;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::__cxx11::to_string(&local_e0,*i_vertex);
  std::operator+(&local_c0,"Vertex index ",&local_e0);
  std::operator+(&local_a0,&local_c0," not in range [0, ");
  std::__cxx11::to_string(&local_100,*i_vertex);
  std::operator+(&local_80,&local_a0,&local_100);
  std::operator+(&local_60,&local_80,").");
  poVar2 = std::operator<<(poVar2,(string *)&local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

[[nodiscard]] inline std::span<std::size_t> operator[](const std::size_t& i_vertex) {
    ASSERT_DEBUG(i_vertex < size_vertex(),
                 "Vertex index " + std::to_string(i_vertex) + " not in range [0, " + std::to_string(i_vertex) + ").");
    return {vertex_adjacent_list.begin() + static_cast<s_size_t>(offset[i_vertex]),
            offset[i_vertex + 1] - offset[i_vertex]};
  }